

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

int ImfTiledOutputWriteTiles
              (ImfTiledOutputFile *out,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  Imf_3_4::TiledRgbaOutputFile::writeTiles((TiledRgbaOutputFile *)out,dxMin,dxMax,dyMin,dyMax,lx,ly)
  ;
  return 1;
}

Assistant:

int
ImfTiledOutputWriteTiles (
    ImfTiledOutputFile* out,
    int                 dxMin,
    int                 dxMax,
    int                 dyMin,
    int                 dyMax,
    int                 lx,
    int                 ly)
{
    try
    {
        outfile (out)->writeTiles (dxMin, dxMax, dyMin, dyMax, lx, ly);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}